

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O2

bool __thiscall
tinyusdz::tydra::GetPropertyNames
          (tydra *this,Prim *prim,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *out_prop_names,string *err)

{
  bool bVar1;
  int iVar2;
  Model *model;
  ostream *poVar3;
  Xform *xform;
  Scope *scope;
  GeomMesh *mesh;
  GeomSubset *pGVar4;
  undefined1 rel_prop;
  undefined7 uVar5;
  allocator local_209;
  string local_208;
  string local_1e8;
  string local_1c8 [32];
  ostringstream ss_e;
  
  rel_prop = SUB81(err,0);
  uVar5 = (undefined7)((ulong)err >> 8);
  if (*(undefined8 **)(this + 0x2a8) == (undefined8 *)0x0) {
LAB_0028cbde:
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar3 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"GetPropertyNames");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x7bd);
    ::std::operator<<(poVar3," ");
    poVar3 = ::std::operator<<((ostream *)&ss_e,"TODO: Prim type ");
    linb::any::type_name_abi_cxx11_((string *)&local_208,(any *)(this + 0x298));
    poVar3 = ::std::operator<<(poVar3,(string *)&local_208);
    ::std::operator<<(poVar3,"\n");
  }
  else {
    iVar2 = (*(code *)**(undefined8 **)(this + 0x2a8))();
    if (iVar2 == 0x401) {
      model = Prim::as<tinyusdz::Model>((Prim *)this);
      bVar1 = anon_unknown_6::GetPrimPropertyNamesImpl<tinyusdz::Model>
                        (model,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)prim,true,(bool)rel_prop);
      if (bVar1) {
        return true;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar3 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"GetPropertyNames");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x7b0);
      ::std::operator<<(poVar3," ");
      ::std::__cxx11::string::string
                (local_1c8,"Failed to list up Property names of Prim type {}",&local_209);
      tinyusdz::value::TypeTraits<tinyusdz::Model>::type_name_abi_cxx11_();
    }
    else {
      if (*(undefined8 **)(this + 0x2a8) == (undefined8 *)0x0) goto LAB_0028cbde;
      iVar2 = (*(code *)**(undefined8 **)(this + 0x2a8))();
      if (iVar2 == 0x404) {
        xform = Prim::as<tinyusdz::Xform>((Prim *)this);
        bVar1 = anon_unknown_6::GetPrimPropertyNamesImpl<tinyusdz::Xform>
                          (xform,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)prim,true,(bool)rel_prop);
        if (bVar1) {
          return true;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar3 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar3 = ::std::operator<<(poVar3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                  );
        poVar3 = ::std::operator<<(poVar3,":");
        poVar3 = ::std::operator<<(poVar3,"GetPropertyNames");
        poVar3 = ::std::operator<<(poVar3,"():");
        poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x7b1);
        ::std::operator<<(poVar3," ");
        ::std::__cxx11::string::string
                  (local_1c8,"Failed to list up Property names of Prim type {}",&local_209);
        tinyusdz::value::TypeTraits<tinyusdz::Xform>::type_name_abi_cxx11_();
      }
      else {
        if (*(undefined8 **)(this + 0x2a8) == (undefined8 *)0x0) goto LAB_0028cbde;
        iVar2 = (*(code *)**(undefined8 **)(this + 0x2a8))();
        if (iVar2 == 0x402) {
          scope = Prim::as<tinyusdz::Scope>((Prim *)this);
          bVar1 = anon_unknown_6::GetPrimPropertyNamesImpl<tinyusdz::Scope>
                            (scope,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)prim,true,(bool)rel_prop);
          if (bVar1) {
            return true;
          }
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar3 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"GetPropertyNames");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x7b2);
          ::std::operator<<(poVar3," ");
          ::std::__cxx11::string::string
                    (local_1c8,"Failed to list up Property names of Prim type {}",&local_209);
          tinyusdz::value::TypeTraits<tinyusdz::Scope>::type_name_abi_cxx11_();
        }
        else {
          if (*(undefined8 **)(this + 0x2a8) == (undefined8 *)0x0) goto LAB_0028cbde;
          iVar2 = (*(code *)**(undefined8 **)(this + 0x2a8))();
          if (iVar2 == 0x405) {
            mesh = Prim::as<tinyusdz::GeomMesh>((Prim *)this);
            bVar1 = anon_unknown_6::GetPrimPropertyNamesImpl<tinyusdz::GeomMesh>
                              (mesh,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)prim,true,(bool)rel_prop);
            if (bVar1) {
              return true;
            }
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar3 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar3 = ::std::operator<<(poVar3,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                      );
            poVar3 = ::std::operator<<(poVar3,":");
            poVar3 = ::std::operator<<(poVar3,"GetPropertyNames");
            poVar3 = ::std::operator<<(poVar3,"():");
            poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x7b3);
            ::std::operator<<(poVar3," ");
            ::std::__cxx11::string::string
                      (local_1c8,"Failed to list up Property names of Prim type {}",&local_209);
            tinyusdz::value::TypeTraits<tinyusdz::GeomMesh>::type_name_abi_cxx11_();
          }
          else {
            if ((*(undefined8 **)(this + 0x2a8) == (undefined8 *)0x0) ||
               (iVar2 = (*(code *)**(undefined8 **)(this + 0x2a8))(), iVar2 != 0x40e))
            goto LAB_0028cbde;
            pGVar4 = Prim::as<tinyusdz::GeomSubset>((Prim *)this);
            if (prim != (Prim *)0x0) {
              bVar1 = TypedAttributeWithFallback<tinyusdz::GeomSubset::ElementType>::authored
                                (&pGVar4->elementType);
              if (bVar1) {
                ::std::__cxx11::string::string
                          ((string *)&ss_e,"elementType",(allocator *)&local_208);
                ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)prim
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &ss_e);
                ::std::__cxx11::string::_M_dispose();
              }
              bVar1 = TypedAttribute<tinyusdz::Token>::authored(&pGVar4->familyName);
              if (bVar1) {
                ::std::__cxx11::string::string((string *)&ss_e,"familyName",(allocator *)&local_208)
                ;
                ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)prim
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &ss_e);
                ::std::__cxx11::string::_M_dispose();
              }
              bVar1 = TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                      ::authored(&pGVar4->indices);
              if (!bVar1) {
                return true;
              }
              ::std::__cxx11::string::string((string *)&ss_e,"indices",(allocator *)&local_208);
              ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)prim,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss_e)
              ;
              ::std::__cxx11::string::_M_dispose();
              return true;
            }
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar3 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar3 = ::std::operator<<(poVar3,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                      );
            poVar3 = ::std::operator<<(poVar3,":");
            poVar3 = ::std::operator<<(poVar3,"GetPropertyNames");
            poVar3 = ::std::operator<<(poVar3,"():");
            poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x7b4);
            ::std::operator<<(poVar3," ");
            ::std::__cxx11::string::string
                      (local_1c8,"Failed to list up Property names of Prim type {}",&local_209);
            tinyusdz::value::TypeTraits<tinyusdz::GeomSubset>::type_name_abi_cxx11_();
          }
        }
      }
    }
    fmt::format<std::__cxx11::string>
              (&local_208,(fmt *)local_1c8,&local_1e8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT71(uVar5,rel_prop));
    poVar3 = ::std::operator<<((ostream *)&ss_e,(string *)&local_208);
    ::std::operator<<(poVar3,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
  }
  ::std::__cxx11::string::_M_dispose();
  if (out_prop_names !=
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::append((string *)out_prop_names);
    ::std::__cxx11::string::_M_dispose();
  }
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
  return false;
}

Assistant:

bool GetPropertyNames(const tinyusdz::Prim &prim,
                      std::vector<std::string> *out_prop_names,
                      std::string *err) {
#define GET_PRIM_PROPERTY_NAMES(__ty)                                     \
  if (prim.is<__ty>()) {                                                  \
    auto ret = GetPrimPropertyNamesImpl(*prim.as<__ty>(), out_prop_names, \
                                        true, true);                      \
    if (!ret) {                                                           \
      PUSH_ERROR_AND_RETURN(                                              \
          fmt::format("Failed to list up Property names of Prim type {}", \
                      value::TypeTraits<__ty>::type_name()));             \
    }                                                                     \
  } else

  GET_PRIM_PROPERTY_NAMES(Model)
  GET_PRIM_PROPERTY_NAMES(Xform)
  GET_PRIM_PROPERTY_NAMES(Scope)
  GET_PRIM_PROPERTY_NAMES(GeomMesh)
  GET_PRIM_PROPERTY_NAMES(GeomSubset)
  // TODO
  // GET_PRIM_PROPERTY_NAMES(Shader)
  // GET_PRIM_PROPERTY_NAMES(Material)
  // GET_PRIM_PROPERTY_NAMES(SkelRoot)
  // GET_PRIM_PROPERTY_NAMES(BlendShape)
  // GET_PRIM_PROPERTY_NAMES(Skeleton)
  // GET_PRIM_PROPERTY_NAMES(SkelAnimation)
  {
    PUSH_ERROR_AND_RETURN("TODO: Prim type " << prim.type_name());
  }

#undef GET_PRIM_PROPERTY_NAMES

  return true;
}